

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

int64_t absl::lts_20250127::anon_unknown_8::FloorToUnit(Duration d,Duration unit)

{
  int64_t iVar1;
  long lVar2;
  Duration rem;
  Duration local_18;
  
  local_18.rep_hi_.lo_ = 0;
  local_18.rep_hi_.hi_ = 0;
  local_18.rep_lo_ = 0;
  iVar1 = IDivDuration(d,unit,&local_18);
  lVar2 = iVar1 + -1;
  if (-1 < (long)local_18.rep_hi_) {
    lVar2 = iVar1;
  }
  if (iVar1 < 1) {
    iVar1 = lVar2;
  }
  return iVar1;
}

Assistant:

inline int64_t FloorToUnit(absl::Duration d, absl::Duration unit) {
  absl::Duration rem;
  int64_t q = absl::IDivDuration(d, unit, &rem);
  return (q > 0 || rem >= ZeroDuration() ||
          q == std::numeric_limits<int64_t>::min())
             ? q
             : q - 1;
}